

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_scalar_cell_solb(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char *filename)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  bool bVar2;
  long lVar3;
  uint uVar4;
  REF_STATUS RVar5;
  FILE *pFVar6;
  void *data;
  void *pvVar7;
  undefined8 uVar8;
  REF_CELL *ppRVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  size_t sVar15;
  REF_INT cell;
  int iVar16;
  int iVar17;
  int iVar18;
  double dVar19;
  REF_INT part;
  int keyword_code;
  REF_LONG ncell_local;
  int version;
  REF_LONG ncell_recv;
  REF_LONG npri;
  REF_LONG ntet;
  REF_LONG ncell;
  REF_INT ncell_int;
  int dim;
  int code;
  REF_INT nodes [27];
  int local_134;
  int local_130;
  int local_12c;
  void *local_128;
  FILE *local_120;
  int local_114;
  size_t local_110;
  ulong local_108;
  ulong local_100;
  int local_f4;
  REF_DBL *local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  ulong local_d0;
  REF_NODE local_c8;
  double local_c0;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar4 = ref_node_synchronize_globals(ref_node);
  if (uVar4 != 0) {
    pcVar14 = "sync";
    uVar8 = 0xc5f;
    goto LAB_0013f79c;
  }
  local_f0 = scalar;
  uVar4 = ref_cell_ncell(ref_grid->cell[8],ref_node,&local_d8);
  if (uVar4 != 0) {
    pcVar14 = "ntet";
    uVar8 = 0xc61;
    goto LAB_0013f79c;
  }
  uVar4 = ref_cell_ncell(ref_grid->cell[10],ref_node,&local_e0);
  if (uVar4 != 0) {
    pcVar14 = "npri";
    uVar8 = 0xc62;
    goto LAB_0013f79c;
  }
  if (local_d8 < 1 || local_e0 != 0) {
    if (local_d8 == 0 && 0 < local_e0) {
      ppRVar9 = ref_grid->cell + 10;
      iVar16 = 0x43;
      goto LAB_0013f80d;
    }
    pcVar14 = "grid must be all tet or all prism";
    uVar8 = 0xc6e;
LAB_0013fb9a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar8,
           "ref_gather_scalar_cell_solb",pcVar14);
  }
  else {
    ppRVar9 = ref_grid->cell + 8;
    iVar16 = 0x42;
LAB_0013f80d:
    ref_cell = *ppRVar9;
    if (ref_grid->mpi->id == 0) {
      pFVar6 = fopen(filename,"w");
      if (pFVar6 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar14 = "unable to open file";
        uVar8 = 0xc74;
        goto LAB_0013fb31;
      }
    }
    else {
      pFVar6 = (FILE *)0x0;
    }
    bVar2 = 10000000 < local_e0 + local_d8;
    iVar18 = bVar2 + 2;
    local_108 = (ulong)bVar2 * 4 + 0xc;
    local_f4 = iVar18;
    if (ref_mpi->id == 0) {
      local_ac = 1;
      sVar10 = fwrite(&local_ac,4,1,pFVar6);
      if (sVar10 == 1) {
        sVar10 = fwrite(&local_f4,4,1,pFVar6);
        if (sVar10 == 1) {
          lVar11 = ftell(pFVar6);
          local_12c = 3;
          sVar10 = fwrite(&local_12c,4,1,pFVar6);
          if (sVar10 == 1) {
            sVar15 = lVar11 + local_108;
            local_114 = local_f4;
            uVar4 = ref_export_meshb_next_position((FILE *)pFVar6,local_f4,sVar15);
            iVar18 = local_114;
            if (uVar4 != 0) {
              pcVar14 = "next p";
              uVar8 = 0xc86;
              goto LAB_0013fb67;
            }
            local_b0 = 3;
            sVar10 = fwrite(&local_b0,4,1,pFVar6);
            if (sVar10 == 1) {
              sVar10 = ftell(pFVar6);
              if (sVar15 == sVar10) goto LAB_0013f88c;
              pcVar14 = "dim inconsistent";
              uVar8 = 0xc89;
            }
            else {
              pcVar14 = "dim";
              sVar15 = 1;
              uVar8 = 0xc88;
            }
          }
          else {
            pcVar14 = "dim code";
            sVar15 = 1;
            uVar8 = 0xc85;
          }
        }
        else {
          pcVar14 = "version";
          sVar15 = 1;
          uVar8 = 0xc82;
        }
      }
      else {
        pcVar14 = "code";
        sVar15 = 1;
        uVar8 = 0xc81;
      }
    }
    else {
      sVar15 = 0;
LAB_0013f88c:
      local_100 = 0;
      cell = 0;
      pvVar7 = (void *)(ulong)(uint)ldim;
      local_120 = pFVar6;
      local_114 = iVar18;
      if (0 < ref_cell->max) {
        local_128 = (void *)(ulong)(uint)ldim;
        local_110 = sVar15;
        do {
          RVar5 = ref_cell_nodes(ref_cell,cell,local_a8);
          if (RVar5 == 0) {
            uVar4 = ref_cell_part(ref_cell,ref_node,cell,&local_130);
            if (uVar4 != 0) {
              pcVar14 = "part";
              uVar8 = 0xc8e;
              goto LAB_0013fb67;
            }
            if (ref_mpi->id == local_130) {
              local_100 = local_100 + 1;
            }
          }
          cell = cell + 1;
          sVar15 = local_110;
          pvVar7 = local_128;
        } while (cell < ref_cell->max);
      }
      local_d0 = local_100;
      uVar4 = ref_mpi_allsum(ref_mpi,&local_d0,1,2);
      uVar12 = local_d0;
      pFVar6 = local_120;
      if (uVar4 != 0) {
        pcVar14 = "sum";
        uVar8 = 0xc94;
        goto LAB_0013fb67;
      }
      if (0x7ffffffe < (long)local_d0) {
        pcVar14 = "requires version 4 solb for 64bit ncell";
        uVar8 = 0xc96;
        goto LAB_0013fb9a;
      }
      iVar18 = (int)pvVar7;
      if (ref_mpi->id == 0) {
        lVar11 = ftell(local_120);
        local_12c = iVar16;
        sVar10 = fwrite(&local_12c,4,1,pFVar6);
        if (sVar10 == 1) {
          sVar15 = lVar11 + uVar12 * (long)(iVar18 * 8) + (long)(iVar18 * 4) + local_108 + 4;
          uVar4 = ref_export_meshb_next_position((FILE *)pFVar6,local_114,sVar15);
          if (uVar4 != 0) {
            pcVar14 = "next p";
            uVar8 = 0xc9e;
            goto LAB_0013fb67;
          }
          local_b4 = (undefined4)local_d0;
          sVar10 = fwrite(&local_b4,4,1,pFVar6);
          if (sVar10 == 1) {
            local_12c = iVar18;
            local_110 = sVar15;
            sVar10 = fwrite(&local_12c,4,1,pFVar6);
            if (sVar10 == 1) {
              local_12c = 1;
              if (0 < iVar18) {
                uVar12 = (ulong)pvVar7 & 0xffffffff;
                do {
                  sVar10 = fwrite(&local_12c,4,1,pFVar6);
                  if (sVar10 != 1) {
                    pcVar14 = "scalar";
                    sVar15 = 1;
                    uVar8 = 0xca5;
                    goto LAB_00140402;
                  }
                  uVar4 = (int)uVar12 - 1;
                  uVar12 = (ulong)uVar4;
                } while (uVar4 != 0);
              }
              pFVar6 = local_120;
              sVar15 = local_110;
              local_128 = pvVar7;
              if (ref_mpi->id != 0) goto LAB_0013fa7d;
              if (0 < ref_cell->max) {
                iVar16 = 0;
                do {
                  RVar5 = ref_cell_nodes(ref_cell,iVar16,local_a8);
                  if (RVar5 == 0) {
                    uVar4 = ref_cell_part(ref_cell,ref_node,iVar16,&local_130);
                    if (uVar4 != 0) {
                      pcVar14 = "part";
                      uVar8 = 0xcab;
                      goto LAB_0013f79c;
                    }
                    if (ref_mpi->id == local_130 && 0 < iVar18) {
                      iVar17 = 0;
                      do {
                        iVar1 = ref_cell->node_per;
                        local_c0 = 0.0;
                        if (0 < (long)iVar1) {
                          lVar11 = 0;
                          do {
                            local_c0 = local_c0 + local_f0[local_a8[lVar11] * iVar18 + iVar17];
                            lVar11 = lVar11 + 1;
                          } while (iVar1 != lVar11);
                        }
                        local_c0 = local_c0 / (double)iVar1;
                        sVar10 = fwrite(&local_c0,8,1,pFVar6);
                        if (sVar10 != 1) {
                          pcVar14 = "cell avg";
                          sVar15 = 1;
                          uVar8 = 0xcb2;
                          goto LAB_00140402;
                        }
                        iVar17 = iVar17 + 1;
                      } while (iVar17 != iVar18);
                    }
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 < ref_cell->max);
              }
              sVar15 = local_110;
              if (1 < ref_mpi->n) {
                lVar11 = (long)(int)local_128;
                iVar16 = 1;
                do {
                  uVar4 = ref_mpi_gather_recv(ref_mpi,&local_e8,1,2,iVar16);
                  lVar3 = local_e8;
                  if (uVar4 != 0) {
                    pcVar14 = "recv ncell";
                    uVar8 = 0xcb8;
                    goto LAB_0013f79c;
                  }
                  if (0 < local_e8) {
                    lVar13 = local_e8 * lVar11;
                    if (lVar13 < 0) {
                      pcVar14 = "malloc data of REF_DBL negative";
                      uVar8 = 0xcba;
                      goto LAB_0013fb9a;
                    }
                    pvVar7 = malloc(lVar13 * 8);
                    if (pvVar7 == (void *)0x0) {
                      pcVar14 = "malloc data of REF_DBL NULL";
                      uVar8 = 0xcba;
                      goto LAB_0013fb31;
                    }
                    uVar4 = ref_mpi_gather_recv(ref_mpi,pvVar7,(int)lVar3 * (int)local_128,3,iVar16)
                    ;
                    if (uVar4 != 0) {
                      pcVar14 = "send data";
                      uVar8 = 0xcbd;
                      goto LAB_0013f79c;
                    }
                    sVar15 = local_e8 * lVar11;
                    sVar10 = fwrite(pvVar7,8,sVar15,local_120);
                    if (sVar15 - sVar10 != 0) {
                      pcVar14 = "worker cell avg";
                      uVar8 = 0xcc0;
                      goto LAB_00140402;
                    }
                    free(pvVar7);
                  }
                  iVar16 = iVar16 + 1;
                  sVar15 = local_110;
                } while (iVar16 < ref_mpi->n);
              }
              goto LAB_0014006f;
            }
            pcVar14 = "n solutions";
            sVar15 = 1;
            uVar8 = 0xca2;
          }
          else {
            pcVar14 = "nnode";
            sVar15 = 1;
            uVar8 = 0xca0;
          }
        }
        else {
          pcVar14 = "keyword code";
          sVar15 = 1;
          uVar8 = 0xc9d;
        }
      }
      else {
LAB_0013fa7d:
        local_c8 = ref_node;
        uVar4 = ref_mpi_gather_send(ref_mpi,&local_100,1,2);
        if (uVar4 != 0) {
          pcVar14 = "send ncell";
          uVar8 = 0xcc6;
LAB_0013fb67:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar8,"ref_gather_scalar_cell_solb",(ulong)uVar4,pcVar14);
          return uVar4;
        }
        if (0 < (long)local_100) {
          lVar11 = local_100 * (long)iVar18;
          if (lVar11 < 0) {
            pcVar14 = "malloc data of REF_DBL negative";
            uVar8 = 0xcc8;
            goto LAB_0013fb9a;
          }
          local_108 = local_100;
          data = malloc(lVar11 * 8);
          if (data == (void *)0x0) {
            pcVar14 = "malloc data of REF_DBL NULL";
            uVar8 = 0xcc8;
LAB_0013fb31:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar8,"ref_gather_scalar_cell_solb",pcVar14);
            return 2;
          }
          iVar16 = (int)local_108;
          if (0 < ref_cell->max) {
            local_110 = (ulong)pvVar7 & 0xffffffff;
            uVar12 = 0;
            local_134 = 0;
            local_128 = data;
            do {
              RVar5 = ref_cell_nodes(ref_cell,(REF_INT)uVar12,local_a8);
              if (RVar5 == 0) {
                local_108 = uVar12;
                uVar4 = ref_cell_part(ref_cell,local_c8,(REF_INT)uVar12,&local_130);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xccb,"ref_gather_scalar_cell_solb",(ulong)uVar4,"part");
                  return uVar4;
                }
                uVar12 = local_108;
                if (ref_mpi->id == local_130) {
                  if (0 < iVar18) {
                    uVar4 = ref_cell->node_per;
                    sVar10 = 0;
                    do {
                      if ((int)uVar4 < 1) {
                        dVar19 = 0.0;
                      }
                      else {
                        dVar19 = 0.0;
                        uVar12 = 0;
                        do {
                          dVar19 = dVar19 + local_f0[sVar10 + (long)local_a8[uVar12] * (long)iVar18]
                          ;
                          uVar12 = uVar12 + 1;
                        } while (uVar4 != uVar12);
                      }
                      *(double *)((long)local_128 + sVar10 * 8 + (long)(local_134 * iVar18) * 8) =
                           dVar19 / (double)(int)uVar4;
                      sVar10 = sVar10 + 1;
                    } while (sVar10 != local_110);
                  }
                  local_134 = local_134 + 1;
                  uVar12 = local_108;
                }
              }
              uVar4 = (int)uVar12 + 1;
              uVar12 = (ulong)uVar4;
            } while ((int)uVar4 < ref_cell->max);
            iVar16 = (int)local_100;
            data = local_128;
          }
          uVar4 = ref_mpi_gather_send(ref_mpi,data,iVar16 * iVar18,3);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xcda,"ref_gather_scalar_cell_solb",(ulong)uVar4,"send data");
            return uVar4;
          }
          free(data);
        }
LAB_0014006f:
        pFVar6 = local_120;
        if (ref_mpi->id != 0) goto LAB_0014007b;
        sVar10 = ftell(local_120);
        if (sVar15 == sVar10) {
          if (ref_mpi->id != 0) {
LAB_0014007b:
            if (ref_grid->mpi->id != 0) {
              return 0;
            }
            fclose(pFVar6);
            return 0;
          }
          local_12c = 0x36;
          sVar10 = fwrite(&local_12c,4,1,pFVar6);
          if (sVar10 == 1) {
            uVar4 = ref_export_meshb_next_position((FILE *)pFVar6,local_114,0);
            if (uVar4 != 0) {
              pcVar14 = "next p";
              uVar8 = 0xce6;
LAB_0013f79c:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar8,"ref_gather_scalar_cell_solb",(ulong)uVar4,pcVar14);
              return uVar4;
            }
            goto LAB_0014007b;
          }
          pcVar14 = "end kw";
          sVar15 = 1;
          uVar8 = 0xce4;
        }
        else {
          pcVar14 = "solb metric record len inconsistent";
          uVar8 = 0xce0;
        }
      }
    }
LAB_00140402:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar8,
           "ref_gather_scalar_cell_solb",pcVar14,sVar15,sVar10);
  }
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_cell_solb(REF_GRID ref_grid, REF_INT ldim,
                                               REF_DBL *scalar,
                                               const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = NULL;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_LONG ncell_local, ncell, ntet, npri;
  int version, code, keyword_code, dim, cell_keyword;
  REF_INT i, header_size, ncell_int;
  REF_FILEPOS next_position;
  REF_INT part, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_average, *data;
  REF_INT node, j, proc;
  REF_LONG ncell_recv;

  next_position = 0;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "ntet");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "npri");
  cell_keyword = REF_EMPTY;
  if (ntet > 0 && npri == 0) {
    /* GmfSolAtTetrahedra 113 - 47 = 66 */
    cell_keyword = 66;
    ref_cell = ref_grid_tet(ref_grid);
  }
  if (ntet == 0 && npri > 0) {
    /* GmfSolAtTetrahedra 114 - 47 = 67 */
    cell_keyword = 67;
    ref_cell = ref_grid_pri(ref_grid);
  }
  RUS(REF_EMPTY, cell_keyword, "grid must be all tet or all prism");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
  }

  if (REF_EXPORT_MESHB_VERTEX_3 < ntet + npri) {
    version = 3;
    header_size = 4 + 8 + 4;
  } else {
    version = 2;
    header_size = 4 + 4 + 4;
  }

  if (ref_mpi_once(ref_mpi)) {
    code = 1;
    REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
    REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
    next_position = (REF_FILEPOS)header_size + ftell(file);
    keyword_code = 3;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    dim = 3;
    REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
    REIS(next_position, ftell(file), "dim inconsistent");
  }

  ncell_local = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell_local++;
    }
  }
  ncell = ncell_local;
  RSS(ref_mpi_allsum(ref_mpi, &ncell, 1, REF_LONG_TYPE), "sum");

  RAS(ncell < (REF_LONG)REF_INT_MAX, "requires version 4 solb for 64bit ncell");

  if (ref_mpi_once(ref_mpi)) {
    next_position = (REF_FILEPOS)header_size + (REF_FILEPOS)(4 + (ldim * 4)) +
                    (REF_FILEPOS)ncell * (REF_FILEPOS)(ldim * 8) + ftell(file);
    /* GmfSolAtTetrahedra 113 - 47 = 66 */
    keyword_code = cell_keyword;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    ncell_int = (int)ncell;
    REIS(1, fwrite(&ncell_int, sizeof(int), 1, file), "nnode");
    keyword_code = ldim; /* one solution at node */
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "n solutions");
    keyword_code = 1; /* solution type 1, scalar */
    for (i = 0; i < ldim; i++) {
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "scalar");
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (i = 0; i < ldim; i++) {
          cell_average = 0.0;
          for (node = 0; node < ref_cell_node_per(ref_cell); node++)
            cell_average += scalar[i + ldim * nodes[node]];
          cell_average /= (REF_DBL)ref_cell_node_per(ref_cell);
          REIS(1, fwrite(&cell_average, sizeof(REF_DBL), 1, file), "cell avg");
        }
      }
    }
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell_recv, 1, REF_LONG_TYPE, proc),
          "recv ncell");
      if (ncell_recv > 0) {
        ref_malloc(data, ldim * ncell_recv, REF_DBL);
        RSS(ref_mpi_gather_recv(ref_mpi, data, (REF_INT)(ldim * ncell_recv),
                                REF_DBL_TYPE, proc),
            "send data");
        REIS((size_t)(ldim * ncell_recv),
             fwrite(data, sizeof(REF_DBL), (size_t)(ldim * ncell_recv), file),
             "worker cell avg");
        ref_free(data);
      }
    }
  } else {
    RSS(ref_mpi_gather_send(ref_mpi, &ncell_local, 1, REF_LONG_TYPE),
        "send ncell");
    if (ncell_local > 0) {
      ref_malloc(data, ldim * ncell_local, REF_DBL);
      j = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (i = 0; i < ldim; i++) {
            cell_average = 0.0;
            for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
              cell_average += scalar[i + ldim * nodes[node]];
            }
            cell_average /= (REF_DBL)ref_cell_node_per(ref_cell);
            data[i + ldim * j] = cell_average;
          }
          j++;
        }
      }
      RSS(ref_mpi_gather_send(ref_mpi, data, (REF_INT)(ldim * ncell_local),
                              REF_DBL_TYPE),
          "send data");
      ref_free(data);
    }
  }

  if (ref_mpi_once(ref_mpi))
    REIS(next_position, ftell(file), "solb metric record len inconsistent");

  if (ref_mpi_once(ref_mpi)) { /* End */
    keyword_code = 54;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "end kw");
    next_position = 0;
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}